

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void bloaty::CheckedAdd(int64_t *accum,int64_t val)

{
  long lVar1;
  
  lVar1 = *accum;
  *accum = *accum + val;
  if (!SCARRY8(lVar1,val)) {
    return;
  }
  Throw("integer overflow",0x7e);
}

Assistant:

void CheckedAdd(int64_t* accum, int64_t val) {
#if ABSL_HAVE_BUILTIN(__builtin_add_overflow)
  if (__builtin_add_overflow(*accum, val, accum)) {
    THROW("integer overflow");
  }
#else
  bool safe = *accum < 0
                  ? (val >= std::numeric_limits<int64_t>::min() - *accum)
                  : (val <= std::numeric_limits<int64_t>::max() - *accum);
  if (!safe) {
    THROW("integer overflow");
  }
  *accum += val;
#endif
}